

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_htmlify(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  wchar_t wVar8;
  vm_obj_id_t vVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  byte *pbVar13;
  char *p;
  byte *p_00;
  byte *pbVar14;
  bool bVar15;
  byte local_48;
  
  if (in_argc == (uint *)0x0) {
    bVar15 = true;
  }
  else {
    bVar15 = *in_argc == 0;
  }
  if (getp_htmlify(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_htmlify();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_htmlify::desc);
  if (iVar6 == 0) {
    if (bVar15) {
      uVar7 = 0;
    }
    else {
      uVar7 = CVmBif::pop_long_val();
    }
    pvVar3 = sp_;
    uVar2 = *(undefined4 *)&self_val->field_0x4;
    aVar1 = self_val->val;
    sp_ = sp_ + 1;
    pvVar3->typ = self_val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    pbVar14 = (byte *)(ulong)*(ushort *)str;
    if (pbVar14 == (byte *)0x0) {
      vVar9 = create(0,0);
    }
    else {
      bVar15 = false;
      lVar12 = 0;
      pbVar13 = pbVar14;
      p_00 = (byte *)(str + 2);
      do {
        wVar8 = utf8_ptr::s_getch((char *)p_00);
        local_48 = (byte)uVar7;
        if (wVar8 < L'&') {
          if (wVar8 == L'\t') {
            lVar12 = lVar12 + (ulong)(uVar7 & 4);
          }
          else {
            if (wVar8 == L'\n') {
LAB_00281a83:
              lVar10 = lVar12 + 3;
              local_48 = local_48 & 2;
            }
            else {
              if (wVar8 != L' ') goto LAB_00281aa9;
              lVar10 = lVar12 + 5;
              if (!bVar15) {
                lVar10 = lVar12;
              }
              local_48 = local_48 & 1;
            }
            if (local_48 != 0) {
              lVar12 = lVar10;
            }
          }
          bVar15 = true;
        }
        else {
          if (wVar8 < L'>') {
            if (wVar8 == L'&') {
              lVar12 = lVar12 + 4;
            }
            else if (wVar8 == L'<') goto LAB_00281a93;
          }
          else if (wVar8 == L'>') {
LAB_00281a93:
            lVar12 = lVar12 + 3;
          }
          else if (wVar8 == L'\x2028') goto LAB_00281a83;
LAB_00281aa9:
          bVar15 = false;
        }
        pbVar13 = p_00 + ((long)pbVar13 -
                         (long)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3)
                                       + 1));
        p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
      } while (pbVar13 != (byte *)0x0);
      bVar15 = false;
      vVar9 = create(0,(size_t)(pbVar14 + lVar12));
      if (pbVar14 != (byte *)0x0) {
        p = (char *)(*(long *)((long)&G_obj_table_X.pages_[vVar9 >> 0xc][vVar9 & 0xfff].ptr_ + 8) +
                    2);
        pbVar13 = (byte *)(str + 2);
        do {
          wVar8 = utf8_ptr::s_getch((char *)pbVar13);
          bVar4 = false;
          if (wVar8 < L'&') {
            if (wVar8 == L'\t') {
              bVar4 = true;
              if ((uVar7 & 4) != 0) {
                cVar5 = '<';
                lVar12 = 1;
                do {
                  sVar11 = utf8_ptr::s_putch(p,(int)cVar5);
                  p = p + sVar11;
                  cVar5 = "<tab>"[lVar12];
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 6);
                bVar15 = true;
                goto LAB_00281cdf;
              }
            }
            else {
              if (wVar8 == L'\n') goto LAB_00281c3f;
              if ((wVar8 == L' ') && (bVar4 = true, bVar15 && (uVar7 & 1) != 0)) {
                cVar5 = '&';
                lVar12 = 1;
                do {
                  sVar11 = utf8_ptr::s_putch(p,(int)cVar5);
                  p = p + sVar11;
                  cVar5 = "&nbsp;"[lVar12];
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 7);
                goto LAB_00281c7d;
              }
            }
LAB_00281c91:
            bVar15 = bVar4;
            sVar11 = utf8_ptr::s_putch(p,wVar8);
            p = p + sVar11;
          }
          else {
            if (wVar8 < L'>') {
              if (wVar8 == L'&') {
                cVar5 = '&';
                lVar12 = 1;
                do {
                  sVar11 = utf8_ptr::s_putch(p,(int)cVar5);
                  p = p + sVar11;
                  cVar5 = "&amp;"[lVar12];
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 6);
              }
              else {
                if (wVar8 != L'<') goto LAB_00281c91;
                cVar5 = '&';
                lVar12 = 0;
                do {
                  sVar11 = utf8_ptr::s_putch(p,(int)cVar5);
                  p = p + sVar11;
                  cVar5 = "&lt;"[lVar12 + 1];
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 4);
              }
            }
            else {
              if (wVar8 == L'\x2028') {
LAB_00281c3f:
                bVar4 = true;
                if ((uVar7 & 2) != 0) {
                  cVar5 = '<';
                  lVar12 = 0;
                  do {
                    sVar11 = utf8_ptr::s_putch(p,(int)cVar5);
                    p = p + sVar11;
                    cVar5 = "<br>"[lVar12 + 1];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 4);
LAB_00281c7d:
                  bVar15 = true;
                  goto LAB_00281cdf;
                }
                goto LAB_00281c91;
              }
              if (wVar8 != L'>') goto LAB_00281c91;
              cVar5 = '&';
              lVar12 = 0;
              do {
                sVar11 = utf8_ptr::s_putch(p,(int)cVar5);
                p = p + sVar11;
                cVar5 = "&gt;"[lVar12 + 1];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
            }
            bVar15 = false;
          }
LAB_00281cdf:
          pbVar14 = pbVar13 + ((long)pbVar14 -
                              (long)(pbVar13 +
                                    (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 &
                                           (uint)(*pbVar13 >> 7) * 3) + 1));
          pbVar13 = pbVar13 + (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 & (uint)(*pbVar13 >> 7) * 3) +
                              1;
        } while (pbVar14 != (byte *)0x0);
      }
    }
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar9;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_htmlify(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val,
                               const char *str, uint *in_argc)
{
    size_t bytelen;
    utf8_ptr p;
    utf8_ptr dstp;
    size_t rem;
    size_t extra;
    long flags;
    vm_obj_id_t result_obj;
    int prv_was_sp;

    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* if they specified flags, pop them */
    if (argc >= 1)
    {
        /* retrieve the flags */
        flags = CVmBif::pop_long_val(vmg0_);
    }
    else
    {
        /* no flags */
        flags = 0;
    }

    /* push a self-reference as GC protection */
    G_stk->push(self_val);

    /* get and skip the string's length prefix */
    bytelen = vmb_get_len(str);
    str += VMB_LEN;

    /* 
     *   scan the string to determine how much space we'll have to add to
     *   generate the htmlified version 
     */
    for (prv_was_sp = FALSE, extra = 0, p.set((char *)str), rem = bytelen ;
         rem != 0 ; p.inc(&rem))
    {
        int this_is_sp;

        /* presume it's not a space */
        this_is_sp = FALSE;
        
        /* check what we have */
        switch(p.getch())
        {
        case '&':
            /* we must replace '&' with '&amp;' - this adds four bytes */
            extra += 4;
            break;
            
        case '<':
            /* we must replace '<' with '&lt;' - this adds three bytes */
            extra += 3;
            break;

        case '>':
            /* replace '>' with '&gt;' */
            extra += 3;
            break;

        case ' ':
            /* 
             *   If we're in preserve-spaces mode, and the previous space
             *   was some kind of whitespace character, change this to
             *   '&nbsp;' - this adds five bytes 
             */
            if (prv_was_sp && (flags & VMSTR_HTMLIFY_KEEP_SPACES) != 0)
                extra += 5;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;

        case '\t':
            /* if we're in preserve-tabs mode, change this to '<tab>' */
            if ((flags & VMSTR_HTMLIFY_KEEP_TABS) != 0)
                extra += 4;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;

        case '\n':
        case 0x2028:
            /* if we're in preserve-newlines mode, change this to '<br>' */
            if ((flags & VMSTR_HTMLIFY_KEEP_NEWLINES) != 0)
                extra += 3;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;
        }

        /* for next time, remember whether this is a space */
        prv_was_sp = this_is_sp;
    }

    /* allocate space for the new string */
    result_obj = create(vmg_ FALSE, bytelen + extra);

    /* get a pointer to the result buffer */
    dstp.set(((CVmObjString *)vm_objp(vmg_ result_obj))->cons_get_buf());

    /* translate the string and write the result */
    for (prv_was_sp = FALSE, p.set((char *)str), rem = bytelen ;
         rem != 0 ; p.inc(&rem))
    {
        wchar_t ch;
        int this_is_sp;

        /* get this character */
        ch = p.getch();

        /* presume it's not a space */
        this_is_sp = FALSE;
        
        /* check what we have */
        switch(ch)
        {
        case '&':
            /* replace '&' with '&amp;' */
            dstp.setch_str("&amp;");
            break;

        case '<':
            /* we must replace '<' with '&lt;' - this adds three bytes */
            dstp.setch_str("&lt;");
            break;

        case '>':
            dstp.setch_str("&gt;");
            break;

        case ' ':
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* 
             *   ignore it if not in preserve-spaces mode, or if the
             *   previous character wasn't whitespace of some kind 
             */
            if (!prv_was_sp || (flags & VMSTR_HTMLIFY_KEEP_SPACES) == 0)
                goto do_default;

            /* add the nbsp */
            dstp.setch_str("&nbsp;");
            break;

        case '\t':
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* ignore if not in preserve-tabs mode */
            if ((flags & VMSTR_HTMLIFY_KEEP_TABS) == 0)
                goto do_default;

            /* add the <tab> */
            dstp.setch_str("<tab>");
            break;

        case '\n':
        case 0x2028:
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* if we're not in preserve-newlines mode, ignore it */
            if ((flags & VMSTR_HTMLIFY_KEEP_NEWLINES) == 0)
                goto do_default;

            /* add the <br> */
            dstp.setch_str("<br>");
            break;

        default:
        do_default:
            /* copy this character unchanged */
            dstp.setch(ch);
            break;
        }

        /* for next time, remember whether this is a space */
        prv_was_sp = this_is_sp;
    }

    /* return the new string */
    retval->set_obj(result_obj);
    
    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}